

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_ec_point_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  uint16_t uVar1;
  int iVar2;
  void *pvVar3;
  CBS ec_point_format_list;
  CBS local_20;
  
  if (contents == (CBS *)0x0) {
    return true;
  }
  uVar1 = ssl_protocol_version(hs->ssl);
  if (((uVar1 < 0x304) && (iVar2 = CBS_get_u8_length_prefixed(contents,&local_20), iVar2 != 0)) &&
     (contents->len == 0)) {
    if ((local_20.len != 0) &&
       (pvVar3 = memchr(local_20.data,0,local_20.len), pvVar3 != (void *)0x0)) {
      return true;
    }
    *out_alert = '/';
  }
  return false;
}

Assistant:

static bool ext_ec_point_parse_serverhello(SSL_HANDSHAKE *hs,
                                           uint8_t *out_alert, CBS *contents) {
  if (contents == NULL) {
    return true;
  }

  if (ssl_protocol_version(hs->ssl) >= TLS1_3_VERSION) {
    return false;
  }

  CBS ec_point_format_list;
  if (!CBS_get_u8_length_prefixed(contents, &ec_point_format_list) ||
      CBS_len(contents) != 0) {
    return false;
  }

  // Per RFC 4492, section 5.1.2, implementations MUST support the uncompressed
  // point format.
  if (OPENSSL_memchr(CBS_data(&ec_point_format_list),
                     TLSEXT_ECPOINTFORMAT_uncompressed,
                     CBS_len(&ec_point_format_list)) == NULL) {
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  return true;
}